

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O0

void __thiscall kj::_::ChainPromiseNode::get(ChainPromiseNode *this,ExceptionOrValue *output)

{
  PromiseNode *pPVar1;
  Fault local_20;
  Fault f;
  ExceptionOrValue *output_local;
  ChainPromiseNode *this_local;
  
  f.exception = (Exception *)output;
  if (*(int *)&(this->super_Event).field_0x24 == 1) {
    pPVar1 = Own<kj::_::PromiseNode>::operator->(&this->inner);
    (*pPVar1->_vptr_PromiseNode[2])(pPVar1,f.exception);
    return;
  }
  Debug::Fault::Fault(&local_20,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async.c++"
                      ,0x34e,FAILED,"state == STEP2","");
  Debug::Fault::fatal(&local_20);
}

Assistant:

void ChainPromiseNode::get(ExceptionOrValue& output) noexcept {
  KJ_REQUIRE(state == STEP2);
  return inner->get(output);
}